

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TImage.cpp
# Opt level: O0

void __thiscall TUPU::TImage::~TImage(TImage *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__TImage_00511ce8;
  free((void *)in_RDI[0x12]);
  std::__cxx11::string::~string((string *)(in_RDI + 0x14));
  std::__cxx11::string::~string((string *)(in_RDI + 0xd));
  std::__cxx11::string::~string((string *)(in_RDI + 9));
  std::__cxx11::string::~string((string *)(in_RDI + 5));
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

TImage::~TImage()
{
    std::free(m_buffer);
}